

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall
Model::get_gaussian_grad
          (Model *this,double **g,double label,double sigma,int centerId,int contextId,
          double current_lr)

{
  uint uVar1;
  double **ppdVar2;
  double **ppdVar3;
  double *pdVar4;
  int d_1;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  uVar8 = (ulong)this->dim_size;
  pvVar5 = operator_new__(uVar8 * 8);
  pvVar6 = operator_new__(uVar8 * 8);
  ppdVar2 = this->emb0;
  ppdVar3 = this->emb1;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    *(double *)((long)pvVar6 + uVar7 * 8) = ppdVar3[contextId][uVar7] - ppdVar2[centerId][uVar7];
  }
  dVar9 = 0.0;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    dVar10 = *(double *)((long)pvVar6 + uVar7 * 8);
    dVar9 = dVar9 + dVar10 * dVar10;
  }
  dVar10 = sigma * sigma;
  dVar9 = exp(-dVar9 / (dVar10 + dVar10));
  uVar1 = this->dim_size;
  for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    *(double *)((long)pvVar5 + uVar7 * 8) =
         (*(double *)((long)pvVar6 + uVar7 * 8) / dVar10) *
         ((label - dVar9) + (label - dVar9)) * dVar9;
  }
  pdVar4 = *g;
  for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    pdVar4[uVar7] = *(double *)((long)pvVar5 + uVar7 * 8) * -current_lr;
  }
  operator_delete__(pvVar6);
  operator_delete__(pvVar5);
  return;
}

Assistant:

void Model::get_gaussian_grad(double *&g, double label, double sigma, int centerId, int contextId, double current_lr) {

    double eta, e, *diff,  *z;
    z = new double[this->dim_size];
    diff = new double[this->dim_size];

    double var = sigma * sigma;

    for (int d = 0; d < this->dim_size; d++)
        diff[d] = this->emb1[contextId][d] - this->emb0[centerId][d];

    eta = 0.0;
    for (int d = 0; d < this->dim_size; d++)
        eta += diff[d]*diff[d];

    e = exp( -eta/(2.0*var) );
    for (int d = 0; d < this->dim_size; d++)
        z[d] = 2.0 * ( label-e  ) * ( e ) * ( diff[d]/var );

    for (int d = 0; d < this->dim_size; d++)
        g[d] = -current_lr * z[d]; // minus comes from the objective function, minimization

    delete [] diff;
    delete [] z;

}